

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexTools.c
# Opt level: O1

void Bmc_CexDumpAogStats(Gia_Man_t *p,abctime clk)

{
  uint uVar1;
  FILE *__stream;
  
  __stream = fopen("cex/aig_stats.txt","a+");
  fprintf(__stream,"%s ",p->pName);
  fprintf(__stream,"%d ",(ulong)(uint)(p->vCis->nSize - p->nRegs));
  fprintf(__stream,"%d ",(ulong)(uint)(~(p->vCos->nSize + p->vCis->nSize) + p->nObjs));
  uVar1 = Gia_ManLevelNum(p);
  fprintf(__stream,"%d ",(ulong)uVar1);
  fprintf(__stream,"%.2f ",(double)clk / 1000000.0);
  fputc(10,__stream);
  fclose(__stream);
  return;
}

Assistant:

void Bmc_CexDumpAogStats( Gia_Man_t * p, abctime clk )
{
    FILE * pTable  = fopen( "cex/aig_stats.txt", "a+" );
    fprintf( pTable, "%s ", p->pName );
    fprintf( pTable, "%d ", Gia_ManPiNum(p) );
    fprintf( pTable, "%d ", Gia_ManAndNum(p) );
    fprintf( pTable, "%d ", Gia_ManLevelNum(p) );
    fprintf( pTable, "%.2f ", 1.0*clk/(CLOCKS_PER_SEC) );
    fprintf( pTable, "\n" );
    fclose( pTable );
}